

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGContentType
xmlRelaxNGGroupContentType(xmlRelaxNGContentType ct1,xmlRelaxNGContentType ct2)

{
  xmlRelaxNGContentType ct2_local;
  xmlRelaxNGContentType ct1_local;
  
  if ((ct1 == XML_RELAXNG_CONTENT_ERROR) || (ct2 == XML_RELAXNG_CONTENT_ERROR)) {
    ct2_local = XML_RELAXNG_CONTENT_ERROR;
  }
  else {
    ct2_local = ct2;
    if ((ct1 != XML_RELAXNG_CONTENT_EMPTY) && (ct2_local = ct1, ct2 != XML_RELAXNG_CONTENT_EMPTY)) {
      if ((ct1 == XML_RELAXNG_CONTENT_COMPLEX) && (ct2 == XML_RELAXNG_CONTENT_COMPLEX)) {
        ct2_local = XML_RELAXNG_CONTENT_COMPLEX;
      }
      else {
        ct2_local = XML_RELAXNG_CONTENT_ERROR;
      }
    }
  }
  return ct2_local;
}

Assistant:

static xmlRelaxNGContentType
xmlRelaxNGGroupContentType(xmlRelaxNGContentType ct1,
                           xmlRelaxNGContentType ct2)
{
    if ((ct1 == XML_RELAXNG_CONTENT_ERROR) ||
        (ct2 == XML_RELAXNG_CONTENT_ERROR))
        return (XML_RELAXNG_CONTENT_ERROR);
    if (ct1 == XML_RELAXNG_CONTENT_EMPTY)
        return (ct2);
    if (ct2 == XML_RELAXNG_CONTENT_EMPTY)
        return (ct1);
    if ((ct1 == XML_RELAXNG_CONTENT_COMPLEX) &&
        (ct2 == XML_RELAXNG_CONTENT_COMPLEX))
        return (XML_RELAXNG_CONTENT_COMPLEX);
    return (XML_RELAXNG_CONTENT_ERROR);
}